

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O1

void inputSwitchDirection(MatrixXd *X,MatrixXd *u)

{
  long lVar1;
  undefined1 auVar2 [16];
  Index size_2;
  double *pdVar3;
  undefined8 *puVar4;
  Index size;
  long lVar5;
  ActualDstType actualDst;
  double *pdVar6;
  long lVar7;
  Index dstCols;
  VectorXd temp1;
  VectorXd temp2;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_48;
  PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> local_38;
  
  pdVar6 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar5 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_48.m_storage.m_data = (double *)0x0;
  local_48.m_storage.m_rows = 0;
  if ((lVar5 != 0) &&
     (auVar2 = ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff),
     SUB168(auVar2 / SEXT816(lVar5),0) < 1)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8,u,SUB168(auVar2 % SEXT816(lVar5),0));
    *puVar4 = operator_new;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_48,lVar5,1);
  lVar1 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (local_48.m_storage.m_rows != lVar5) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_48,lVar5,1);
  }
  if (0 < local_48.m_storage.m_rows) {
    lVar5 = 0;
    do {
      local_48.m_storage.m_data[lVar5] = *pdVar6;
      lVar5 = lVar5 + 1;
      pdVar6 = pdVar6 + lVar1;
    } while (local_48.m_storage.m_rows != lVar5);
  }
  pdVar6 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data;
  lVar5 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  local_38.m_storage.m_data = (double *)0x0;
  local_38.m_storage.m_rows = 0;
  if ((lVar5 != 0) &&
     (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar5),0) < 1)) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = operator_new;
    __cxa_throw(puVar4,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
  }
  Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_38,lVar5,1);
  lVar1 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  if (local_38.m_storage.m_rows != lVar5) {
    Eigen::PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize(&local_38,lVar5,1);
  }
  if (0 < local_38.m_storage.m_rows) {
    lVar5 = 0;
    do {
      local_38.m_storage.m_data[lVar5] = *pdVar6;
      lVar5 = lVar5 + 1;
      pdVar6 = pdVar6 + lVar1;
    } while (local_38.m_storage.m_rows != lVar5);
  }
  lVar5 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
  pdVar3 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data +
           1;
  lVar1 = (X->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  pdVar6 = pdVar3;
  lVar7 = lVar1;
  if (0 < lVar1) {
    do {
      pdVar6[-1] = *pdVar6;
      lVar7 = lVar7 + -1;
      pdVar6 = pdVar6 + lVar5;
    } while (lVar7 != 0);
  }
  if (0 < lVar1) {
    lVar7 = 0;
    do {
      *pdVar3 = local_48.m_storage.m_data[lVar7];
      lVar7 = lVar7 + 1;
      pdVar3 = pdVar3 + lVar5;
    } while (lVar1 != lVar7);
  }
  lVar5 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols;
  if (0 < lVar5) {
    lVar1 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_rows;
    pdVar3 = (u->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_data
             + 1;
    pdVar6 = pdVar3;
    lVar7 = lVar5;
    do {
      pdVar6[-1] = *pdVar6;
      pdVar6 = pdVar6 + lVar1;
      lVar7 = lVar7 + -1;
    } while (lVar7 != 0);
    if (0 < lVar5) {
      lVar7 = 0;
      do {
        *pdVar3 = local_38.m_storage.m_data[lVar7];
        lVar7 = lVar7 + 1;
        pdVar3 = pdVar3 + lVar1;
      } while (lVar5 != lVar7);
    }
  }
  free(local_38.m_storage.m_data);
  free(local_48.m_storage.m_data);
  return;
}

Assistant:

void inputSwitchDirection(Eigen::MatrixXd &X, Eigen::MatrixXd &u){
	Eigen::VectorXd temp1 = X.row(0);
	Eigen::VectorXd temp2 = u.row(0);
	X.row(0) = X.row(1);
	X.row(1) = temp1;
	u.row(0) = u.row(1);
	u.row(1) = temp2; 
}